

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  __type _Var3;
  _Ios_Openmode __a;
  Argument *pAVar4;
  ofstream *local_8d0;
  bool local_86a;
  bool local_7a1;
  string_view local_7a0;
  bool local_789;
  string_view local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  bool local_751;
  string_view local_750;
  bool local_739;
  string_view local_738;
  bool local_721;
  string_view local_720;
  bool local_709;
  string_view local_708;
  bool local_6f1;
  string_view local_6f0;
  long local_6e0;
  ofstream outf;
  long local_4e0;
  ifstream inf;
  ostream *local_2d8;
  ostream *output;
  ifstream *input;
  undefined1 local_2b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> output_file;
  undefined1 local_288 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input_file;
  runtime_error *err;
  string local_258;
  allocator<char> local_231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  any local_210;
  allocator<char> local_1f9;
  string local_1f8;
  bool local_1d1;
  any local_1d0;
  bool local_1b9;
  any local_1b8;
  allocator<char> local_1a1;
  string local_1a0;
  bool local_179;
  any local_178;
  bool local_161;
  any local_160;
  allocator<char> local_149;
  string local_148;
  bool local_121;
  any local_120;
  bool local_109;
  any local_108;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  ArgumentParser program;
  char **argv_local;
  int argc_local;
  
  program.mArgumentMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"vm",&local_b9);
  argparse::ArgumentParser::ArgumentParser((ArgumentParser *)local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*>((ArgumentParser *)local_98,"input");
  pAVar4 = argparse::Argument::required(pAVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"speicify the file to be assembled/executed.",&local_f1);
  argparse::Argument::help(pAVar4,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*>((ArgumentParser *)local_98,"-d");
  local_109 = false;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_108,&local_109);
  pAVar4 = argparse::Argument::default_value(pAVar4,&local_108);
  local_121 = true;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_120,&local_121);
  pAVar4 = argparse::Argument::implicit_value(pAVar4,&local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"disassemble the binary input file.",&local_149);
  argparse::Argument::help(pAVar4,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::any::~any(&local_120);
  std::any::~any(&local_108);
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*>((ArgumentParser *)local_98,"-a");
  local_161 = false;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_160,&local_161);
  pAVar4 = argparse::Argument::default_value(pAVar4,&local_160);
  local_179 = true;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_178,&local_179);
  pAVar4 = argparse::Argument::implicit_value(pAVar4,&local_178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"assemble the text input file.",&local_1a1);
  argparse::Argument::help(pAVar4,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::any::~any(&local_178);
  std::any::~any(&local_160);
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*>((ArgumentParser *)local_98,"-r");
  local_1b9 = false;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_1b8,&local_1b9);
  pAVar4 = argparse::Argument::default_value(pAVar4,&local_1b8);
  local_1d1 = true;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_1d0,&local_1d1);
  pAVar4 = argparse::Argument::implicit_value(pAVar4,&local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"interpret the binary input file.",&local_1f9);
  argparse::Argument::help(pAVar4,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::any::~any(&local_1d0);
  std::any::~any(&local_1b8);
  pAVar4 = argparse::ArgumentParser::add_argument<char_const*>((ArgumentParser *)local_98,"output");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"-",&local_231);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_210,&local_230);
  pAVar4 = argparse::Argument::default_value(pAVar4,&local_210);
  pAVar4 = argparse::Argument::required(pAVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"specify the output file.",(allocator<char> *)((long)&err + 7));
  argparse::Argument::help(pAVar4,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)((long)&err + 7));
  std::any::~any(&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  argparse::ArgumentParser::parse_args
            ((ArgumentParser *)local_98,argc,
             (char **)program.mArgumentMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&output_file.field_2 + 8),
             "input");
  argparse::ArgumentParser::get<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
             (ArgumentParser *)local_98,stack0xfffffffffffffd68);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&input,"output");
  argparse::ArgumentParser::get<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
             (ArgumentParser *)local_98,_input);
  std::ifstream::ifstream(&local_4e0);
  std::ofstream::ofstream(&local_6e0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_6f0,"-d");
  pAVar4 = argparse::ArgumentParser::operator[]((ArgumentParser *)local_98,local_6f0);
  local_6f1 = true;
  bVar1 = argparse::Argument::operator==(pAVar4,&local_6f1);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_708,"-a");
    pAVar4 = argparse::ArgumentParser::operator[]((ArgumentParser *)local_98,local_708);
    local_709 = true;
    bVar1 = argparse::Argument::operator==(pAVar4,&local_709);
    local_86a = true;
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_720,"-r");
      pAVar4 = argparse::ArgumentParser::operator[]((ArgumentParser *)local_98,local_720);
      local_721 = true;
      local_86a = argparse::Argument::operator==(pAVar4,&local_721);
    }
    if (local_86a != false) {
      exit(2);
    }
    std::operator|(_S_bin,_S_in);
    std::ifstream::open((string *)&local_4e0,(_Ios_Openmode)local_288);
    bVar2 = std::ios::operator!((ios *)((long)&local_4e0 + *(long *)(local_4e0 + -0x18)));
    if ((bVar2 & 1) != 0) {
      exit(2);
    }
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2b8,"-");
    if (bVar1) {
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_288,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2b8);
      if (_Var3) {
        std::__cxx11::string::operator+=((string *)local_2b8,".out");
      }
      std::operator|(_S_out,_S_trunc);
      std::ofstream::open((string *)&local_6e0,(_Ios_Openmode)local_2b8);
      bVar2 = std::ios::operator!((ios *)((long)&local_6e0 + *(long *)(local_6e0 + -0x18)));
      if ((bVar2 & 1) != 0) {
        std::ifstream::close();
        exit(2);
      }
      local_2d8 = (ostream *)&local_6e0;
    }
    else {
      local_2d8 = (ostream *)&std::cout;
    }
    disassemble_binary((ifstream *)&local_4e0,local_2d8);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_738,"-a");
    pAVar4 = argparse::ArgumentParser::operator[]((ArgumentParser *)local_98,local_738);
    local_739 = true;
    bVar1 = argparse::Argument::operator==(pAVar4,&local_739);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_750,"-d");
      pAVar4 = argparse::ArgumentParser::operator[]((ArgumentParser *)local_98,local_750);
      local_751 = true;
      bVar1 = argparse::Argument::operator==(pAVar4,&local_751);
      if (bVar1) {
        exit(2);
      }
      std::ifstream::open((string *)&local_4e0,(_Ios_Openmode)local_288);
      bVar2 = std::ios::operator!((ios *)((long)&local_4e0 + *(long *)(local_4e0 + -0x18)));
      if ((bVar2 & 1) != 0) {
        exit(2);
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2b8,"-");
      if ((bVar1) ||
         (_Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_288,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_2b8), _Var3)) {
        std::operator+(&local_778,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_288,".out");
        std::__cxx11::string::operator=((string *)local_2b8,(string *)&local_778);
        std::__cxx11::string::~string((string *)&local_778);
      }
      __a = std::operator|(_S_bin,_S_out);
      std::operator|(__a,_S_trunc);
      std::ofstream::open((string *)&local_6e0,(_Ios_Openmode)local_2b8);
      bVar2 = std::ios::operator!((ios *)((long)&local_6e0 + *(long *)(local_6e0 + -0x18)));
      if ((bVar2 & 1) != 0) {
        std::ifstream::close();
        exit(2);
      }
      if (&local_6e0 == (long *)0x0) {
        local_8d0 = (ofstream *)0x0;
      }
      else {
        local_8d0 = (ofstream *)
                    __dynamic_cast(&local_6e0,&std::ostream::typeinfo,&std::ofstream::typeinfo,0);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_788,"-r");
      pAVar4 = argparse::ArgumentParser::operator[]((ArgumentParser *)local_98,local_788);
      local_789 = true;
      bVar1 = argparse::Argument::operator==(pAVar4,&local_789);
      assemble_text((ifstream *)&local_4e0,local_8d0,bVar1);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7a0,"-r");
      pAVar4 = argparse::ArgumentParser::operator[]((ArgumentParser *)local_98,local_7a0);
      local_7a1 = true;
      bVar1 = argparse::Argument::operator==(pAVar4,&local_7a1);
      if (!bVar1) {
        exit(2);
      }
      std::operator|(_S_bin,_S_in);
      std::ifstream::open((string *)&local_4e0,(_Ios_Openmode)local_288);
      bVar2 = std::ios::operator!((ios *)((long)&local_4e0 + *(long *)(local_4e0 + -0x18)));
      if ((bVar2 & 1) != 0) {
        exit(2);
      }
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2b8,"-");
      if (bVar1) {
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_288,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2b8);
        if (_Var3) {
          std::__cxx11::string::operator+=((string *)local_2b8,".out");
        }
        std::operator|(_S_out,_S_trunc);
        std::ofstream::open((string *)&local_6e0,(_Ios_Openmode)local_2b8);
        bVar2 = std::ios::operator!((ios *)((long)&local_6e0 + *(long *)(local_6e0 + -0x18)));
        if ((bVar2 & 1) != 0) {
          std::ifstream::close();
          exit(2);
        }
        local_2d8 = (ostream *)&local_6e0;
      }
      else {
        local_2d8 = (ostream *)&std::cout;
      }
      execute((ifstream *)&local_4e0,local_2d8);
    }
  }
  std::ifstream::close();
  std::ofstream::close();
  std::ofstream::~ofstream(&local_6e0);
  std::ifstream::~ifstream(&local_4e0);
  std::__cxx11::string::~string((string *)local_2b8);
  std::__cxx11::string::~string((string *)local_288);
  argparse::ArgumentParser::~ArgumentParser((ArgumentParser *)local_98);
  return 0;
}

Assistant:

int main (int argc, char** argv) {
    argparse::ArgumentParser program("vm");
	program.add_argument("input")
        .required()
		.help("speicify the file to be assembled/executed.");
	program.add_argument("-d")
		.default_value(false)
		.implicit_value(true)
		.help("disassemble the binary input file.");
	program.add_argument("-a")
		.default_value(false)
		.implicit_value(true)
		.help("assemble the text input file.");
    program.add_argument("-r")
		.default_value(false)
		.implicit_value(true)
		.help("interpret the binary input file.");
    program.add_argument("output")
		.default_value(std::string("-"))
        .required()
		.help("specify the output file.");

	try {
		program.parse_args(argc, argv);
	}
	catch (const std::runtime_error& err) {
		std::cout << program;
		exit(2);
	}

	auto input_file = program.get<std::string>("input");
	auto output_file = program.get<std::string>("output");
	std::ifstream* input;
	std::ostream* output;
	std::ifstream inf;
	std::ofstream outf;
    //std::unique_ptr<vm::VM> vm;

    if (program["-d"] == true) {
        if (program["-a"] == true || program["-r"] == true) {
            exit(2);
        }
        
        inf.open(input_file, std::ios::binary | std::ios::in);
        if (!inf) {
            exit(2);
        }
        input = &inf;

        if (output_file != "-") {
            if (input_file == output_file) {
                output_file += ".out";
            }
            outf.open(output_file, std::ios::out | std::ios::trunc);
            if (!outf) {
                inf.close();
                exit(2);
            }
            output = &outf;
        }
        else {
            output = &std::cout;
        }
        disassemble_binary(input, output);
    }
    else if (program["-a"] == true) {
        if (program["-d"] == true) {
            exit(2);
        }
        
        inf.open(input_file, std::ios::in);
        if (!inf) {
            exit(2);
        }
        input = &inf;

        if (output_file == "-" || input_file == output_file) {
            output_file = input_file + ".out";
        }
        outf.open(output_file, std::ios::binary | std::ios::out | std::ios::trunc);
        if (!outf) {
            inf.close();
            exit(2);
        }
        output = &outf;
        assemble_text(input, dynamic_cast<std::ofstream*>(output), program["-r"] == true);
    }
    else if (program["-r"] == true) {
        inf.open(input_file, std::ios::binary | std::ios::in);
        if (!inf) {
            exit(2);
        }
        input = &inf;

        if (output_file != "-") {
            if (input_file == output_file) {
                output_file += ".out";
            }
            outf.open(output_file, std::ios::out | std::ios::trunc);
            if (!outf) {
                inf.close();
                exit(2);
            }
            output = &outf;
        }
        else {
            output = &std::cout;
        }

        execute(input, output);
    }
    else {
        exit(2);
    }
    inf.close();
    outf.close();
    return 0;
}